

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

Resource res_getArrayItem_63(ResourceData *pResData,Resource array,int32_t indexR)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  if (indexR < 0) {
    return 0xffffffff;
  }
  uVar2 = array & 0xfffffff;
  if (array >> 0x1c == 9) {
    uVar3 = (uint)pResData->p16BitUnits[uVar2];
    if (indexR < (int)uVar3) {
      uVar1 = pResData->p16BitUnits[(ulong)uVar2 + (ulong)(uint)indexR + 1];
      uVar2 = (uint)uVar1;
      if (pResData->poolStringIndex16Limit <= (int)(uint)uVar1) {
        uVar2 = ((uint)uVar1 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
      }
      uVar2 = uVar2 | 0x60000000;
    }
  }
  else {
    if (array >> 0x1c != 8) {
      return 0xffffffff;
    }
    if (uVar2 == 0) {
      return 0xffffffff;
    }
    uVar3 = pResData->pRoot[uVar2];
    if (indexR < (int)uVar3) {
      uVar2 = pResData->pRoot[(ulong)uVar2 + (ulong)(uint)indexR + 1];
    }
  }
  if ((int)uVar3 <= indexR) {
    return 0xffffffff;
  }
  return uVar2;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getArrayItem(const ResourceData *pResData, Resource array, int32_t indexR) {
    uint32_t offset=RES_GET_OFFSET(array);
    if (indexR < 0) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(array)) {
    case URES_ARRAY: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            if(indexR<*p) {
                return (Resource)p[1+indexR];
            }
        }
        break;
    }
    case URES_ARRAY16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        if(indexR<*p) {
            return makeResourceFrom16(pResData, p[1+indexR]);
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}